

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

uint32_t __thiscall spirv_cross::ParsedIR::increase_bound_by(ParsedIR *this,uint32_t incr_amount)

{
  size_t sVar1;
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> _Var2;
  Variant *pVVar3;
  size_t sVar4;
  size_t count;
  
  sVar1 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
  count = incr_amount + sVar1;
  SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,count);
  if (incr_amount != 0) {
    sVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
    do {
      _Var2._M_head_impl =
           (this->pool_group)._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
      SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,sVar4 + 1);
      pVVar3 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr;
      sVar4 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
      pVVar3[sVar4].group = _Var2._M_head_impl;
      pVVar3[sVar4].holder = (IVariant *)0x0;
      pVVar3[sVar4].type = TypeNone;
      pVVar3[sVar4].allow_type_rewrite = false;
      sVar4 = sVar4 + 1;
      (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size = sVar4;
      incr_amount = incr_amount - 1;
    } while (incr_amount != 0);
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,count);
  return (uint32_t)sVar1;
}

Assistant:

uint32_t ParsedIR::increase_bound_by(uint32_t incr_amount)
{
	auto curr_bound = ids.size();
	auto new_bound = curr_bound + incr_amount;

	ids.reserve(ids.size() + incr_amount);
	for (uint32_t i = 0; i < incr_amount; i++)
		ids.emplace_back(pool_group.get());

	block_meta.resize(new_bound);
	return uint32_t(curr_bound);
}